

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

int AF__PlayerInfo_PoisonPlayer
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *player;
  AActor *poisoner;
  AActor *source;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((player = (player_t *)(param->field_0).field_1.a, param[1].field_0.field_1.atag == 1 ||
            (param[1].field_0.field_1.a == (void *)0x0)))) {
          poisoner = (AActor *)param[1].field_0.field_1.a;
          if (poisoner != (AActor *)0x0) {
            if ((poisoner->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(poisoner->super_DThinker).super_DObject._vptr_DObject)(poisoner);
              (poisoner->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var,iVar2);
            }
            pPVar3 = (poisoner->super_DThinker).super_DObject.Class;
            bVar5 = pPVar3 == (PClass *)0x0;
            bVar6 = !bVar5;
            defaultparam = (TArray<VMValue,_VMValue> *)
                           CONCAT71((int7)((ulong)defaultparam >> 8),pPVar3 == pPVar1 || bVar5);
            if (pPVar3 != pPVar1 && !bVar5) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar6 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar6) {
              pcVar4 = "poisoner == NULL || poisoner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_003ffcab;
            }
          }
          pPVar1 = AActor::RegistrationInfo.MyClass;
          if (numparam < 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((param[2].field_0.field_1.atag == 1 || (param[2].field_0.field_1.a == (void *)0x0)))
               ) {
              source = (AActor *)param[2].field_0.field_1.a;
              if (source != (AActor *)0x0) {
                if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                  iVar2 = (**(source->super_DThinker).super_DObject._vptr_DObject)
                                    (source,defaultparam);
                  (source->super_DThinker).super_DObject.Class =
                       (PClass *)CONCAT44(extraout_var_00,iVar2);
                }
                pPVar3 = (source->super_DThinker).super_DObject.Class;
                bVar6 = pPVar3 != (PClass *)0x0;
                if (pPVar3 != pPVar1 && bVar6) {
                  do {
                    pPVar3 = pPVar3->ParentClass;
                    bVar6 = pPVar3 != (PClass *)0x0;
                    if (pPVar3 == pPVar1) break;
                  } while (pPVar3 != (PClass *)0x0);
                }
                if (!bVar6) {
                  pcVar4 = "source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))";
                  goto LAB_003ffcca;
                }
              }
              if (numparam == 3) {
                pcVar4 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  bVar6 = P_PoisonPlayer(player,poisoner,source,param[3].field_0.i);
                  if (numret < 1) {
                    iVar2 = 0;
                  }
                  else {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                                    ,0x6dc,
                                    "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    if (ret->RegType != '\0') {
                      __assert_fail("RegType == REGT_INT",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                    ,0x13f,"void VMReturn::SetInt(int)");
                    }
                    *(uint *)ret->Location = (uint)bVar6;
                    iVar2 = 1;
                  }
                  return iVar2;
                }
                pcVar4 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                            ,0x6db,
                            "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar4 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_003ffcca:
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x6da,
                        "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003ffcab:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x6d9,
                    "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                ,0x6d8,
                "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(_PlayerInfo, PoisonPlayer)
{
	PARAM_SELF_STRUCT_PROLOGUE(player_t);
	PARAM_OBJECT(poisoner, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(poison);
	ACTION_RETURN_BOOL(P_PoisonPlayer(self, poisoner, source, poison));
}